

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

long __thiscall
boost::asio::detail::
timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::wait_duration_usec
          (timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,long max_duration)

{
  pointer t1;
  duration_type dVar1;
  time_type local_18;
  
  t1 = (this->heap_).
       super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (t1 != (this->heap_).
            super__Vector_base<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<boost::asio::detail::timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
    local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dVar1 = chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>
            ::subtract(&t1->time_,&local_18);
    if (dVar1.__r < 1) {
      max_duration = 0;
    }
    else {
      if ((long)((ulong)dVar1.__r / 1000) < max_duration) {
        max_duration = (ulong)dVar1.__r / 1000;
      }
      if ((ulong)dVar1.__r < 1000) {
        max_duration = 1;
      }
    }
  }
  return max_duration;
}

Assistant:

virtual long wait_duration_usec(long max_duration) const
  {
    if (heap_.empty())
      return max_duration;

    return this->to_usec(
        Time_Traits::to_posix_duration(
          Time_Traits::subtract(heap_[0].time_, Time_Traits::now())),
        max_duration);
  }